

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

void Abc_QuickSortCostData(int *pCosts,int nSize,int fDecrease,word *pData,int *pResult)

{
  int local_2c;
  int i;
  int *pResult_local;
  word *pData_local;
  int fDecrease_local;
  int nSize_local;
  int *pCosts_local;
  
  for (local_2c = 0; local_2c < nSize; local_2c = local_2c + 1) {
    pData[local_2c] = (long)local_2c << 0x20 | (long)pCosts[local_2c];
  }
  Abc_QuickSort3(pData,nSize,fDecrease);
  for (local_2c = 0; local_2c < nSize; local_2c = local_2c + 1) {
    pResult[local_2c] = (int)(pData[local_2c] >> 0x20);
  }
  return;
}

Assistant:

void Abc_QuickSortCostData( int * pCosts, int nSize, int fDecrease, word * pData, int * pResult )
{
    int i;
    for ( i = 0; i < nSize; i++ )
        pData[i] = ((word)i << 32) | pCosts[i];
    Abc_QuickSort3( pData, nSize, fDecrease );
    for ( i = 0; i < nSize; i++ )
        pResult[i] = (int)(pData[i] >> 32);
}